

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::has_active_builtin(Compiler *this,BuiltIn builtin,StorageClass storage)

{
  long lVar1;
  _Node_iterator_base<unsigned_int,_false> _Var2;
  char *pcVar3;
  key_type local_4;
  
  if (storage == StorageClassInput) {
    lVar1 = 0xa40;
  }
  else {
    if (storage != StorageClassOutput) {
      return false;
    }
    lVar1 = 0xa80;
  }
  pcVar3 = (this->ir).ids.stack_storage.aligned_char + lVar1 + -0x40;
  if (builtin < 0x40) {
    _Var2._M_cur = (__node_type *)(*(ulong *)pcVar3 >> ((ulong)builtin & 0x3f) & 1);
  }
  else {
    _Var2._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)(pcVar3 + 8),&local_4);
  }
  return _Var2._M_cur != (__node_type *)0x0;
}

Assistant:

bool Compiler::has_active_builtin(BuiltIn builtin, StorageClass storage)
{
	const Bitset *flags;
	switch (storage)
	{
	case StorageClassInput:
		flags = &active_input_builtins;
		break;
	case StorageClassOutput:
		flags = &active_output_builtins;
		break;

	default:
		return false;
	}
	return flags->get(builtin);
}